

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_NetworkAdapterEnumerator.cpp
# Opt level: O0

void axl::io::NetworkAdapterEnumerator::setupAdapter
               (NetworkAdapterDesc *adapter,ifaddrs *iface,Socket *socket)

{
  bool bVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  int result;
  ifreq req;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffbc;
  ifreq *in_stack_ffffffffffffffc0;
  uint_t in_stack_ffffffffffffffcc;
  undefined2 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd2;
  undefined2 in_stack_ffffffffffffffd6;
  
  if ((*(uint *)(in_RSI + 0x10) & 8) == 0) {
    uVar3 = 2;
    if ((*(uint *)(in_RSI + 0x10) & 0x10) != 0) {
      uVar3 = 4;
    }
  }
  else {
    uVar3 = 1;
  }
  *(undefined4 *)(in_RDI + 0x10) = uVar3;
  *(undefined4 *)(in_RDI + 0x14) = 0;
  if ((*(uint *)(in_RSI + 0x10) & 2) != 0) {
    *(uint *)(in_RDI + 0x14) = *(uint *)(in_RDI + 0x14) | 4;
  }
  if ((*(uint *)(in_RSI + 0x10) & 0x1000) != 0) {
    *(uint *)(in_RDI + 0x14) = *(uint *)(in_RDI + 0x14) | 8;
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator=
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_ffffffffffffffc0,
             (C *)CONCAT44(in_stack_ffffffffffffffbc,uVar3));
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator=
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)in_stack_ffffffffffffffc0,
             (C *)CONCAT44(in_stack_ffffffffffffffbc,uVar3));
  bVar1 = sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::isOpen
                    ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)
                     in_stack_ffffffffffffffc0);
  if (bVar1) {
    strncpy(&stack0xffffffffffffffc0,*(char **)(in_RSI + 8),0x10);
    iVar2 = psx::File::ioctl<ifreq*>
                      ((File *)CONCAT26(in_stack_ffffffffffffffd6,
                                        CONCAT42(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0
                                                )),in_stack_ffffffffffffffcc,
                       in_stack_ffffffffffffffc0);
    if (-1 < iVar2) {
      *(undefined4 *)(in_RDI + 0x58) = in_stack_ffffffffffffffd2;
      *(undefined2 *)(in_RDI + 0x5c) = in_stack_ffffffffffffffd6;
    }
  }
  return;
}

Assistant:

void
NetworkAdapterEnumerator::setupAdapter(
	NetworkAdapterDesc* adapter,
	ifaddrs* iface,
	io::psx::Socket* socket
) {
	adapter->m_type =
		(iface->ifa_flags & IFF_LOOPBACK) ? NetworkAdapterType_Loopback :
		(iface->ifa_flags & IFF_POINTOPOINT) ? NetworkAdapterType_Ppp :
		NetworkAdapterType_Ethernet;

	adapter->m_flags = 0;

	if (iface->ifa_flags & IFF_BROADCAST)
		adapter->m_flags |= NetworkAdapterFlag_Broadcast;

	if (iface->ifa_flags & IFF_MULTICAST)
		adapter->m_flags |= NetworkAdapterFlag_Multicast;

	adapter->m_name = iface->ifa_name;
	adapter->m_description = iface->ifa_name; // no special description

#if (_AXL_IO_USE_SIOCGIFHWADDR)
	if (socket->isOpen()) { // try to get MAC-address
		ifreq req;
		strncpy(req.ifr_name, iface->ifa_name, countof(req.ifr_name));
		int result = socket->ioctl(SIOCGIFHWADDR, &req);
		if (result >= 0)
			memcpy(adapter->m_macAddress, req.ifr_ifru.ifru_hwaddr.sa_data, sizeof(adapter->m_macAddress));
	}
#endif
}